

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.c
# Opt level: O0

SPARCCPU_conflict1 * cpu_sparc_init_sparc64(uc_struct_conflict9 *uc)

{
  CPUClass *k;
  SPARCCPUClass_conflict *scc;
  CPUClass *cc;
  CPUState *cs;
  SPARCCPU_conflict1 *cpu;
  uc_struct_conflict9 *uc_local;
  
  uc_local = (uc_struct_conflict9 *)malloc(0xb440);
  if ((CPUState *)uc_local == (CPUState *)0x0) {
    uc_local = (uc_struct_conflict9 *)0x0;
  }
  else {
    memset(uc_local,0,0xb440);
    if (uc->cpu_model == 0x7fffffff) {
      uc->cpu_model = 0xb;
    }
    else if (0x10 < (uint)uc->cpu_model) {
      free(uc_local);
      return (SPARCCPU_conflict1 *)0x0;
    }
    k = (CPUClass *)(((CPUState *)((long)uc_local + 0x81c0))->tb_jmp_cache + 0x611);
    ((CPUState *)uc_local)->cc = k;
    ((CPUState *)uc_local)->uc = (uc_struct_conflict7 *)uc;
    uc->cpu = (CPUState *)uc_local;
    cpu_class_init((uc_struct *)uc,k);
    sparc_cpu_class_init(uc,k);
    cpu_common_initfn((uc_struct *)uc,(CPUState *)uc_local);
    ((CPUState *)((long)uc_local + 0x81c0))->tb_jmp_cache[0x627] =
         (TranslationBlock *)(sparc_defs + uc->cpu_model);
    sparc_cpu_initfn(uc,(CPUState *)uc_local);
    sparc_cpu_realizefn(uc,(CPUState *)uc_local);
    cpu_address_space_init_sparc64((CPUState *)uc_local,0,((CPUState *)uc_local)->memory);
    qemu_init_vcpu_sparc64((CPUState *)uc_local);
  }
  return (SPARCCPU_conflict1 *)uc_local;
}

Assistant:

SPARCCPU *cpu_sparc_init(struct uc_struct *uc)
{
    SPARCCPU *cpu;
    CPUState *cs;
    CPUClass *cc;
    SPARCCPUClass *scc;

    cpu = malloc(sizeof(*cpu));
    if (cpu == NULL) {
        return NULL;
    }
    memset(cpu, 0, sizeof(*cpu));

    if (uc->cpu_model == INT_MAX) {
#ifdef TARGET_SPARC64
        uc->cpu_model = UC_CPU_SPARC64_SUN_ULTRASPARC_IV; // Sun UltraSparc IV
#else
        uc->cpu_model = UC_CPU_SPARC32_LEON3; // Leon 3
#endif
    } else if (uc->cpu_model >= ARRAY_SIZE(sparc_defs)) {
        free(cpu);
        return NULL;
    }

    cs = (CPUState *)cpu;
    cc = (CPUClass *)&cpu->cc;
    cs->cc = cc;
    cs->uc = uc;
    uc->cpu = cs;

    /* init CPUClass */
    cpu_class_init(uc, cc);
    /* init SPARCCPUClass */
    sparc_cpu_class_init(uc, cc);
    /* init CPUState */
    cpu_common_initfn(uc, cs);
    /* init SPARC types scc->def */
    scc = SPARC_CPU_CLASS(cc);
    scc->cpu_def = &sparc_defs[uc->cpu_model];

    /* init SPARCCPU */
    sparc_cpu_initfn(uc, cs);
    /* realize SPARCCPU */
    sparc_cpu_realizefn(uc, cs);
    /* realize CPUState */

    // init address space
    cpu_address_space_init(cs, 0, cs->memory);

    qemu_init_vcpu(cs);

    return cpu;
}